

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

float __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,float,duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
          *accessor)

{
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>
  __comp;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>
  __comp_00;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>
  __comp_01;
  QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
  *in_RCX;
  QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
  *in_RDI;
  float hi;
  float lo;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>
  comp;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  unsigned_long *in_stack_ffffffffffffffa8;
  unsigned_long *in_stack_ffffffffffffffb0;
  Vector *in_stack_ffffffffffffffc0;
  QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
  *in_stack_ffffffffffffffc8;
  idx_t *in_stack_ffffffffffffffd0;
  float local_4;
  
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>
  ::QuantileCompare((QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>
                     *)&stack0xffffffffffffffc0,in_RCX,(bool)(*(byte *)&in_RDI->outer & 1));
  if (in_RDI[1].inner == (QuantileIndirect<float> *)in_RDI[1].outer) {
    __comp.accessor_r = in_stack_ffffffffffffffc8;
    __comp.accessor_l =
         (QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
          *)in_stack_ffffffffffffffc0;
    __comp._16_8_ = in_stack_ffffffffffffffd0;
    ::std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>>
              ((unsigned_long *)in_stack_ffffffffffffffc8,(unsigned_long *)in_stack_ffffffffffffffc0
               ,(unsigned_long *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               __comp);
    QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>::
    operator()(in_RDI,in_stack_ffffffffffffffd0);
    local_4 = CastInterpolation::Cast<float,float>
                        ((float *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    __comp_00.accessor_r = in_stack_ffffffffffffffc8;
    __comp_00.accessor_l =
         (QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
          *)in_stack_ffffffffffffffc0;
    __comp_00._16_8_ = in_stack_ffffffffffffffd0;
    ::std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               __comp_00);
    __comp_01.accessor_r = in_stack_ffffffffffffffc8;
    __comp_01.accessor_l =
         (QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
          *)in_stack_ffffffffffffffc0;
    __comp_01._16_8_ = in_stack_ffffffffffffffd0;
    ::std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               __comp_01);
    QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>::
    operator()(in_RDI,in_stack_ffffffffffffffd0);
    CastInterpolation::Cast<float,float>
              ((float *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>::
    operator()(in_RDI,in_stack_ffffffffffffffd0);
    CastInterpolation::Cast<float,float>
              ((float *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    local_4 = CastInterpolation::Interpolate<float>
                        ((float *)in_RDI,(double)in_stack_ffffffffffffffd0,
                         (float *)in_stack_ffffffffffffffc8);
  }
  return local_4;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}